

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qglobalstatic.h
# Opt level: O2

Type * QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::(anonymous_namespace)::Q_QGS_customTypeRegistry>_>
       ::instance(void)

{
  int iVar1;
  long in_FS_OFFSET;
  InterfaceType *local_38;
  QArrayDataPointer<char> local_30;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  if (QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::(anonymous_namespace)::Q_QGS_customTypeRegistry>>
      ::instance()::holder == '\0') {
    iVar1 = __cxa_guard_acquire(&QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::(anonymous_namespace)::Q_QGS_customTypeRegistry>>
                                 ::instance()::holder);
    if (iVar1 != 0) {
      QReadWriteLock::QReadWriteLock(&instance::holder.storage.lock,NonRecursive);
      instance::holder.storage.registry.d.size = 0;
      instance::holder.storage.aliases.d =
           (QHash<QByteArray,_const_QtPrivate::QMetaTypeInterface_*>)(Data *)0x0;
      instance::holder.storage.registry.d.d = (Data *)0x0;
      instance::holder.storage.registry.d.ptr = (QMetaTypeInterface **)0x0;
      instance::holder.storage.firstEmpty = 0;
      QByteArray::QByteArray((QByteArray *)&local_30,"qfloat16",-1);
      local_38 = &QtPrivate::QMetaTypeInterfaceWrapper<qfloat16>::metaType;
      QHash<QByteArray,QtPrivate::QMetaTypeInterface_const*>::
      emplace<QtPrivate::QMetaTypeInterface_const*const&>
                ((QHash<QByteArray,QtPrivate::QMetaTypeInterface_const*> *)
                 &instance::holder.storage.aliases,(QByteArray *)&local_30,&local_38);
      QArrayDataPointer<char>::~QArrayDataPointer(&local_30);
      QtGlobalStatic::Holder<(anonymous_namespace)::(anonymous_namespace)::Q_QGS_customTypeRegistry>
      ::guard._q_value.super___atomic_base<signed_char>._M_i =
           (Type)(__atomic_base<signed_char>)0xff;
      __cxa_atexit(QtGlobalStatic::
                   Holder<(anonymous_namespace)::(anonymous_namespace)::Q_QGS_customTypeRegistry>::
                   ~Holder,&instance::holder,&__dso_handle);
      __cxa_guard_release(&QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::(anonymous_namespace)::Q_QGS_customTypeRegistry>>
                           ::instance()::holder);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return (Type *)&instance::holder;
  }
  __stack_chk_fail();
}

Assistant:

static Type *instance() noexcept(Holder::ConstructionIsNoexcept)
    {
        static Holder holder;
        return holder.pointer();
    }